

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDefaultVertexAttributeTests.cpp
# Opt level: O2

Vector<unsigned_int,_4> __thiscall
deqp::gles3::Functional::(anonymous_namespace)::convertToTypeVec<unsigned_int,4,float,4>
          (_anonymous_namespace_ *this,Vector<float,_4> *v)

{
  int ndx;
  long lVar1;
  undefined8 extraout_RDX;
  Vector<unsigned_int,_4> VVar2;
  
  tcu::Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)this);
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    *(undefined4 *)(this + lVar1 * 4) = 0;
  }
  *(undefined4 *)(this + 0xc) = 1;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    *(int *)(this + lVar1 * 4) = (int)(long)v->m_data[lVar1];
  }
  VVar2.m_data[2] = (int)extraout_RDX;
  VVar2.m_data[3] = (int)((ulong)extraout_RDX >> 0x20);
  VVar2.m_data._0_8_ = this;
  return (Vector<unsigned_int,_4>)VVar2.m_data;
}

Assistant:

tcu::Vector<T1, S1> convertToTypeVec (const tcu::Vector<T2, S2>& v)
{
	tcu::Vector<T1, S1> retVal;

	for (int ndx = 0; ndx < S1; ++ndx)
		retVal[ndx] = T1(0);

	if (S1 == 4)
		retVal[3] = T1(1);

	for (int ndx = 0; ndx < de::min(S1, S2); ++ndx)
		retVal[ndx] = T1(v[ndx]);

	return retVal;
}